

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

Variable * __thiscall soul::ModuleCloner::cloneVariable(ModuleCloner *this,Variable *old)

{
  Module *this_00;
  mapped_type *pmVar1;
  Variable *pVVar2;
  Expression *pEVar3;
  Type local_40;
  Identifier local_28;
  
  local_40._0_8_ = old;
  pmVar1 = std::__detail::
           _Map_base<soul::pool_ref<const_soul::heart::Variable>,_std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::Variable>,_std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Variable>_>,_std::hash<soul::pool_ref<const_soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->variableMappings,(key_type *)&local_40);
  if (pmVar1->object == (Variable *)0x0) {
    this_00 = this->newModule;
    cloneType(&local_40,this,&old->type);
    local_28 = Identifier::Pool::get(&this->newModule->allocator->identifiers,&old->name);
    pVVar2 = Module::
             allocate<soul::heart::Variable,soul::CodeLocation_const&,soul::Type,soul::Identifier,soul::heart::Variable::Role_const&>
                       (this_00,&(old->super_Expression).super_Object.location,&local_40,&local_28,
                        &old->role);
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)((long)&local_40 + 0x10));
    pVVar2->externalHandle = old->externalHandle;
    if ((old->initialValue).object != (Expression *)0x0) {
      pEVar3 = pool_ptr<soul::heart::Expression>::operator*(&old->initialValue);
      pEVar3 = cloneExpression(this,pEVar3);
      (pVVar2->initialValue).object = pEVar3;
    }
    Annotation::operator=(&pVVar2->annotation,&old->annotation);
    pmVar1->object = pVVar2;
    return pVVar2;
  }
  throwInternalCompilerError("mapping == nullptr","cloneVariable",0xf4);
}

Assistant:

heart::Variable& cloneVariable (const heart::Variable& old)
    {
        auto& mapping = variableMappings[old];
        SOUL_ASSERT (mapping == nullptr);
        auto& v = newModule.allocate<heart::Variable> (old.location, cloneType (old.type),
                                                       newModule.allocator.get (old.name),
                                                       old.role);
        v.externalHandle = old.externalHandle;

        if (old.initialValue != nullptr)
            v.initialValue = cloneExpression (*old.initialValue);

        v.annotation = old.annotation;
        mapping = v;
        return v;
    }